

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O2

void __thiscall QRect::moveTopLeft(QRect *this,QPoint *p)

{
  int iVar1;
  
  iVar1 = (p->xp).m_i;
  (this->x2).m_i = (this->x2).m_i + (iVar1 - (this->x1).m_i);
  (this->x1).m_i = iVar1;
  iVar1 = (p->yp).m_i;
  (this->y2).m_i = (this->y2).m_i + (iVar1 - (this->y1).m_i);
  (this->y1).m_i = iVar1;
  return;
}

Assistant:

constexpr Int value() const noexcept { return m_i; }